

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void dropColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  long lVar1;
  int iVar2;
  sqlite3 *db_00;
  uchar *puVar3;
  RenameToken *pRVar4;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  RenameToken *pEnd;
  sqlite3_xauth xAuth;
  char *zNew;
  char *zEnd;
  Table *pTab;
  RenameToken *pCol;
  int rc;
  char *zDb;
  int iCol;
  char *zSql;
  int iSchema;
  sqlite3 *db;
  Parse sParse;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  uint in_stack_fffffffffffffdd4;
  uint uVar5;
  sqlite3 *in_stack_fffffffffffffdd8;
  sqlite3_context *pCtx;
  uchar *local_210;
  int local_1f4;
  undefined1 local_1b0 [64];
  Table *local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  db_00 = sqlite3_context_db_handle(in_RDI);
  sqlite3_value_int((sqlite3_value *)0x22887c);
  puVar3 = sqlite3_value_text((sqlite3_value *)0x22888e);
  iVar2 = sqlite3_value_int((sqlite3_value *)0x2288a1);
  memset(local_1b0,0xaa,0x1a8);
  pCtx = (sqlite3_context *)db_00->xAuth;
  db_00->xAuth = (sqlite3_xauth)0x0;
  local_1f4 = renameParseSql((Parse *)0x0,(char *)pCtx,in_stack_fffffffffffffdd8,
                             (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                             in_stack_fffffffffffffdcc);
  if (local_1f4 == 0) {
    if (((local_50 == (Table *)0x0) || (local_50->nCol == 1)) || (local_50->nCol <= iVar2)) {
      local_1f4 = sqlite3CorruptError(0);
    }
    else {
      pRVar4 = renameTokenFind((Parse *)local_1b0,(RenameCtx *)0x0,local_50->aCol[iVar2].zCnName);
      if (iVar2 < local_50->nCol + -1) {
        in_stack_fffffffffffffdd8 =
             (sqlite3 *)
             renameTokenFind((Parse *)local_1b0,(RenameCtx *)0x0,local_50->aCol[iVar2 + 1].zCnName);
        local_210 = (uchar *)((Token *)&in_stack_fffffffffffffdd8->pVdbe)->z;
      }
      else {
        local_210 = puVar3 + (local_50->u).tab.addColOffset;
        uVar5 = in_stack_fffffffffffffdd4;
        while( true ) {
          in_stack_fffffffffffffdd4 = uVar5 & 0xffffff;
          if (*(pRVar4->t).z != '\0') {
            in_stack_fffffffffffffdd4 = CONCAT13(*(pRVar4->t).z != ',',(int3)uVar5);
          }
          if ((char)(in_stack_fffffffffffffdd4 >> 0x18) == '\0') break;
          (pRVar4->t).z = (pRVar4->t).z + -1;
          uVar5 = in_stack_fffffffffffffdd4;
        }
      }
      sqlite3MPrintf(db_00,"%.*s%s",(long)(pRVar4->t).z - (long)puVar3,puVar3,local_210);
      sqlite3_result_text(pCtx,(char *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                          (_func_void_void_ptr *)
                          CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      sqlite3_free((void *)0x228b0a);
    }
  }
  renameParseCleanup((Parse *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  db_00->xAuth = (sqlite3_xauth)pCtx;
  if (local_1f4 != 0) {
    sqlite3_result_error_code
              ((sqlite3_context *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdcc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void dropColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  int iSchema = sqlite3_value_int(argv[0]);
  const char *zSql = (const char*)sqlite3_value_text(argv[1]);
  int iCol = sqlite3_value_int(argv[2]);
  const char *zDb = db->aDb[iSchema].zDbSName;
  int rc;
  Parse sParse;
  RenameToken *pCol;
  Table *pTab;
  const char *zEnd;
  char *zNew = 0;

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  UNUSED_PARAMETER(NotUsed);
  rc = renameParseSql(&sParse, zDb, db, zSql, iSchema==1);
  if( rc!=SQLITE_OK ) goto drop_column_done;
  pTab = sParse.pNewTable;
  if( pTab==0 || pTab->nCol==1 || iCol>=pTab->nCol ){
    /* This can happen if the sqlite_schema table is corrupt */
    rc = SQLITE_CORRUPT_BKPT;
    goto drop_column_done;
  }

  pCol = renameTokenFind(&sParse, 0, (void*)pTab->aCol[iCol].zCnName);
  if( iCol<pTab->nCol-1 ){
    RenameToken *pEnd;
    pEnd = renameTokenFind(&sParse, 0, (void*)pTab->aCol[iCol+1].zCnName);
    zEnd = (const char*)pEnd->t.z;
  }else{
    assert( IsOrdinaryTable(pTab) );
    zEnd = (const char*)&zSql[pTab->u.tab.addColOffset];
    while( ALWAYS(pCol->t.z[0]!=0) && pCol->t.z[0]!=',' ) pCol->t.z--;
  }

  zNew = sqlite3MPrintf(db, "%.*s%s", pCol->t.z-zSql, zSql, zEnd);
  sqlite3_result_text(context, zNew, -1, SQLITE_TRANSIENT);
  sqlite3_free(zNew);

drop_column_done:
  renameParseCleanup(&sParse);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  if( rc!=SQLITE_OK ){
    sqlite3_result_error_code(context, rc);
  }
}